

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int decode_new_session_ticket
              (ptls_t *tls,uint32_t *lifetime,uint32_t *age_add,ptls_iovec_t *nonce,
              ptls_iovec_t *ticket,uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  ushort *puVar1;
  ushort uVar2;
  st_ptls_on_extension_t *psVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ushort *puVar9;
  ulong uVar10;
  ushort *puVar11;
  ushort *puVar12;
  ushort uVar13;
  long lVar14;
  ushort *puVar15;
  ptls_iovec_t pVar16;
  byte local_48 [12];
  uint local_3c;
  ushort *local_38;
  
  if ((long)end - (long)src < 4) {
    return 0x32;
  }
  uVar6 = *(uint *)src;
  *lifetime = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  if ((long)end - (long)(src + 4) < 4) {
    return 0x32;
  }
  uVar6 = *(uint *)(src + 4);
  *age_add = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  puVar12 = (ushort *)(src + 8);
  uVar6 = 0x32;
  if (puVar12 == (ushort *)end) {
    bVar4 = false;
  }
  else {
    uVar10 = (ulong)(byte)*puVar12;
    puVar12 = (ushort *)(src + 9);
    bVar4 = false;
    if (uVar10 <= (ulong)((long)end - (long)puVar12)) {
      nonce->base = (uint8_t *)puVar12;
      puVar12 = (ushort *)((long)puVar12 + uVar10);
      nonce->len = uVar10;
      bVar4 = true;
      uVar6 = 0;
    }
  }
  if (!bVar4) {
    return uVar6;
  }
  uVar8 = 0x32;
  puVar9 = puVar12;
  if (1 < (ulong)((long)end - (long)puVar12)) {
    lVar14 = 0;
    uVar10 = 0;
    do {
      uVar10 = (ulong)*(byte *)((long)puVar12 + lVar14) | uVar10 << 8;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 2);
    puVar15 = puVar12 + 1;
    puVar9 = puVar15;
    if (uVar10 - 1 < (ulong)((long)end - (long)puVar15)) {
      puVar9 = (ushort *)((long)puVar12 + uVar10 + 2);
      ticket->base = (uint8_t *)puVar15;
      ticket->len = (long)puVar9 - (long)puVar15;
      bVar4 = true;
      uVar8 = uVar6;
      goto LAB_0011b2ac;
    }
  }
  bVar4 = false;
LAB_0011b2ac:
  if (bVar4) {
    *max_early_data_size = 0;
    local_48[0] = 0x21;
    local_48[1] = 0x24;
    local_48[2] = 1;
    local_48[3] = 0;
    local_48[4] = 0;
    local_48[5] = 0x3a;
    local_48[6] = 8;
    local_48[7] = 0;
    uVar6 = 0x32;
    if ((ulong)((long)end - (long)puVar9) < 2) {
      bVar4 = false;
      puVar12 = puVar9;
    }
    else {
      lVar14 = 0;
      uVar10 = 0;
      do {
        uVar10 = (ulong)*(byte *)((long)puVar9 + lVar14) | uVar10 << 8;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 2);
      puVar12 = puVar9 + 1;
      uVar6 = 0x32;
      if ((ulong)((long)end - (long)puVar12) < uVar10) {
LAB_0011b31f:
        bVar4 = false;
      }
      else {
        uVar6 = uVar8;
        if (uVar10 != 0) {
          puVar9 = (ushort *)((long)puVar9 + uVar10 + 2);
          local_38 = puVar9;
          puVar15 = puVar12;
          do {
            if ((long)puVar9 - (long)puVar15 < 2) {
              uVar6 = 0x32;
              puVar12 = puVar15;
              goto LAB_0011b31f;
            }
            uVar2 = *puVar15;
            uVar13 = uVar2 << 8 | uVar2 >> 8;
            puVar12 = puVar15 + 1;
            if (uVar13 < 0x40) {
              if ((local_48[uVar13 >> 3] >> (uVar13 & 7) & 1) != 0) {
                uVar6 = 0x2f;
                goto LAB_0011b31f;
              }
              if (uVar13 < 0x40) {
                local_48[uVar13 >> 3] =
                     local_48[uVar13 >> 3] | (byte)(1 << ((byte)(uVar2 >> 8) & 7));
              }
            }
            uVar6 = 0x32;
            if ((ulong)((long)puVar9 - (long)puVar12) < 2) {
              uVar8 = 0;
            }
            else {
              lVar14 = 0;
              uVar10 = 0;
              do {
                uVar10 = (ulong)*(byte *)((long)puVar12 + lVar14) | uVar10 << 8;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 2);
              puVar12 = puVar15 + 2;
              uVar8 = 0;
              if (uVar10 <= (ulong)((long)puVar9 - (long)puVar12)) {
                psVar3 = tls->ctx->on_extension;
                local_3c = (uint)uVar13;
                uVar6 = uVar8;
                if (psVar3 != (st_ptls_on_extension_t *)0x0) {
                  pVar16.len = uVar10;
                  pVar16.base = (uint8_t *)puVar12;
                  local_3c = (uint)uVar13;
                  iVar7 = (*psVar3->cb)(psVar3,tls,'\x04',uVar13,pVar16);
                  uVar6 = (uint)(iVar7 != 0);
                  puVar9 = local_38;
                  if (iVar7 != 0) {
                    uVar8 = 0;
                    goto LAB_0011b48b;
                  }
                }
                puVar1 = (ushort *)(uVar10 + (long)puVar12);
                puVar11 = puVar1;
                uVar5 = uVar6;
                if ((short)local_3c == 0x2a) {
                  uVar6 = 0x32;
                  if (3 < (long)uVar10) {
                    uVar6 = *(uint *)(puVar15 + 2);
                    *max_early_data_size =
                         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                         uVar6 << 0x18;
                    puVar12 = puVar15 + 4;
                    uVar6 = 0;
                  }
                  uVar8 = 0;
                  puVar11 = puVar12;
                  uVar5 = 0;
                  if ((long)uVar10 < 4) goto LAB_0011b48b;
                }
                uVar6 = uVar5;
                uVar8 = (uint)(puVar11 == puVar1);
                puVar12 = puVar11;
                if (puVar11 != puVar1) {
                  uVar6 = 0x32;
                }
              }
            }
LAB_0011b48b:
            if ((char)uVar8 == '\0') goto LAB_0011b31f;
            puVar15 = puVar12;
          } while (puVar12 != puVar9);
        }
        bVar4 = true;
      }
    }
    uVar8 = uVar6;
    if (bVar4) {
      uVar8 = 0x32;
      if (puVar12 == (ushort *)end) {
        uVar8 = 0;
      }
    }
  }
  return uVar8;
}

Assistant:

static int decode_new_session_ticket(ptls_t *tls, uint32_t *lifetime, uint32_t *age_add, ptls_iovec_t *nonce, ptls_iovec_t *ticket,
                                     uint32_t *max_early_data_size, const uint8_t *src, const uint8_t *const end)
{
    uint16_t exttype;
    int ret;

    if ((ret = ptls_decode32(lifetime, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode32(age_add, &src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(src, end, 1, {
        *nonce = ptls_iovec_init(src, end - src);
        src = end;
    });
    ptls_decode_open_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        *ticket = ptls_iovec_init(src, end - src);
        src = end;
    });

    *max_early_data_size = 0;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, &exttype, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if ((ret = ptls_decode32(max_early_data_size, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    ret = 0;
Exit:
    return ret;
}